

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::SetDstReg(LinearScan *this,Instr *instr)

{
  uint uVar1;
  RegOpnd *regOpnd;
  StackSym *this_00;
  Lifetime *this_01;
  Opnd *pOVar2;
  Opnd *this_02;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  RegNum RVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  SymOpnd *newDst;
  uint32 newUseValue;
  char *this_03;
  LinearScan *pLVar11;
  ulong uVar12;
  ulong uVar13;
  RegNum local_38;
  BVIndex index;
  
  regOpnd = (RegOpnd *)instr->m_dst;
  if (regOpnd == (RegOpnd *)0x0) {
    return;
  }
  OVar4 = IR::Opnd::GetKind((Opnd *)regOpnd);
  if (OVar4 != OpndKindReg) {
    return;
  }
  OVar4 = IR::Opnd::GetKind((Opnd *)regOpnd);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005873f3;
    *puVar9 = 0;
  }
  if ((regOpnd->field_0x18 & 2) != 0) {
    RVar6 = regOpnd->m_reg;
    BVUnitT<unsigned_long>::AssertRange((uint)RVar6);
    (this->callSetupRegs).word = (this->callSetupRegs).word | 1L << (RVar6 & (RegXMM15|RegXMM14));
  }
  this_00 = regOpnd->m_sym;
  if (this_00 == (StackSym *)0x0) {
LAB_00586dbe:
    RVar6 = regOpnd->m_reg;
    if (("\x01\f\f\f\n\x01\x01\x04\x04\f\f\f\f\n\n\n\n"[RVar6] & 1) == 0) {
      SpillReg(this,RVar6,false);
    }
    BVUnitT<unsigned_long>::AssertRange((uint)RVar6);
    (this->tempRegs).word =
         (this->tempRegs).word &
         (-2L << (RVar6 & (RegXMM15|RegXMM14)) |
         0xfffffffffffffffeU >> 0x40 - (RVar6 & (RegXMM15|RegXMM14)));
    return;
  }
  if (((this_00->field_0x1a & 0x10) != 0) && (*(short *)&(this_00->super_Sym).field_0x16 == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
    if (!bVar5) goto LAB_005873f3;
    *puVar9 = 0;
  }
  if ((this_00->field_0x1a & 0x10) != 0) goto LAB_00586dbe;
  if (regOpnd->m_reg != RegNOREG) {
    RecordLoopUse(this,(Lifetime *)0x0,regOpnd->m_reg);
    return;
  }
  this_01 = *(Lifetime **)&(this_00->scratch).globOpt;
  newUseValue = 0;
  if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
    uVar1 = this->loopNest;
    if (uVar1 < 6) {
      newUseValue = 1 << ((char)uVar1 * '\x03' & 0x1fU);
    }
    else {
      newUseValue = uVar1 * 0x8000 - 0x28000;
    }
  }
  Lifetime::SubFromUseCount(this_01,newUseValue,this->curLoop);
  if ((*(ushort *)&this_01->field_0x9c & 1) == 0) {
    if ((*(ushort *)&this_01->field_0x9c & 0x10) != 0) {
      if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x3c1,"(this->IsInHelperBlock())","this->IsInHelperBlock()");
        if (!bVar5) goto LAB_005873f3;
        *puVar9 = 0;
      }
      uVar1 = this_01->start;
      uVar8 = HelperBlockStartInstrNumber(this);
      if (uVar8 <= uVar1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x3c2,"(lifetime->start < this->HelperBlockStartInstrNumber())",
                           "lifetime->start < this->HelperBlockStartInstrNumber()");
        if (!bVar5) goto LAB_005873f3;
        *puVar9 = 0;
      }
      RVar6 = this_01->reg;
      uVar12 = (ulong)RVar6;
      BVUnitT<unsigned_long>::AssertRange((uint)RVar6);
      uVar13 = 1L << (RVar6 & (RegXMM15|RegXMM14));
      if (((this->opHelperSpilledRegs).word >> (uVar12 & 0x3f) & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x3c5,"(this->opHelperSpilledRegs.Test(reg))",
                           "this->opHelperSpilledRegs.Test(reg)");
        if (!bVar5) goto LAB_005873f3;
        *puVar9 = 0;
      }
      BVUnitT<unsigned_long>::AssertRange((uint)RVar6);
      if (((this->activeRegs).word & uVar13) != 0) {
        SpillReg(this,RVar6,false);
      }
      SetCantOpHelperSpill(this,this_01);
      AddToActive(this,this_01);
      BVUnitT<unsigned_long>::AssertRange((uint)RVar6);
      (this->tempRegs).word = (this->tempRegs).word & ~uVar13;
      BVUnitT<unsigned_long>::AssertRange((uint)RVar6);
      (this->activeRegs).word = (this->activeRegs).word | uVar13;
      if (uVar12 - 1 < 0x10) {
        this->intRegUsedCount = this->intRegUsedCount + 1;
      }
      else {
        if (0xf < uVar12 - 0x11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0x3de,"(RegTypes[reg] == TyFloat64)","RegTypes[reg] == TyFloat64");
          if (!bVar5) goto LAB_005873f3;
          *puVar9 = 0;
        }
        this->floatRegUsedCount = this->floatRegUsedCount + 1;
      }
    }
    RecordDef(this,this_01,instr,newUseValue);
    pLVar11 = this;
    goto LAB_00587361;
  }
  bVar5 = StackSym::IsConst(this_00);
  if ((bVar5) && (bVar5 = IsSymNonTempLocalVar(this,this_00), !bVar5)) {
    return;
  }
  local_38 = regOpnd->m_reg;
  pLVar11 = this;
  if (local_38 == RegNOREG) {
    pOVar2 = instr->m_src1;
    this_02 = instr->m_src2;
    if ((((pOVar2 == (Opnd *)0x0) || (OVar4 = IR::Opnd::GetKind(pOVar2), OVar4 != OpndKindReg)) ||
        (pRVar10 = IR::Opnd::AsRegOpnd(pOVar2), pRVar10->m_sym != this_00)) &&
       (((this_02 == (Opnd *)0x0 || (OVar4 = IR::Opnd::GetKind(this_02), OVar4 != OpndKindReg)) ||
        (pRVar10 = IR::Opnd::AsRegOpnd(this_02), pRVar10->m_sym != this_00)))) {
      this_03 = (char *)this;
      RVar6 = SecondChanceAllocation(this,this_01,false);
      index = (BVIndex)RVar6;
      if (RVar6 == RegNOREG) {
        RVar6 = GetAssignedTempReg(this,this_01,(regOpnd->super_Opnd).m_type);
        index = (BVIndex)RVar6;
        goto LAB_0058726c;
      }
      if ((this_00->field_0x18 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        this_03 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
        ;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x386,"(!stackSym->m_isSingleDef)","!stackSym->m_isSingleDef");
        if (!bVar5) goto LAB_005873f3;
        *puVar9 = 0;
      }
      SetReg((LinearScan *)this_03,regOpnd);
      RecordDef(this,this_01,instr,newUseValue);
LAB_005872d5:
      local_38 = (RegNum)index;
      bVar5 = false;
    }
    else {
      RVar6 = GetAssignedTempReg(this,this_01,(regOpnd->super_Opnd).m_type);
      index = (BVIndex)RVar6;
      if (RVar6 == RegNOREG) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x37c,"(reg != RegNOREG)","reg != RegNOREG");
        if (!bVar5) goto LAB_005873f3;
        *puVar9 = 0;
      }
LAB_0058726c:
      RecordDef(this,this_01,instr,0);
      pLVar11 = (LinearScan *)instr;
      bVar5 = LowererMD::IsAssign(instr);
      local_38 = (RegNum)index;
      if (bVar5) {
        pLVar11 = (LinearScan *)instr->m_src1;
        OVar4 = IR::Opnd::GetKind((Opnd *)pLVar11);
        if (OVar4 == OpndKindReg) {
          if (local_38 != RegNOREG) {
            BVUnitT<unsigned_long>::AssertRange(index);
            (this->tempRegs).word =
                 (this->tempRegs).word &
                 (-2L << (local_38 & (RegXMM15|RegXMM14)) |
                 0xfffffffffffffffeU >> 0x40 - (local_38 & (RegXMM15|RegXMM14)));
          }
          newDst = IR::SymOpnd::New(&this_00->super_Sym,instr->m_src1->m_type,this->func);
          pLVar11 = (LinearScan *)instr;
          IR::Instr::ReplaceDst(instr,&newDst->super_Opnd);
          goto LAB_005872d5;
        }
      }
      bVar5 = true;
      if (local_38 == RegNOREG) {
        pOVar2 = instr->m_src1;
        if (((pOVar2 == (Opnd *)0x0) || (OVar4 = IR::Opnd::GetKind(pOVar2), OVar4 != OpndKindReg))
           || (pRVar10 = IR::Opnd::AsRegOpnd(pOVar2), pRVar10->m_sym != this_00)) {
          local_38 = FindReg(this,(Lifetime *)0x0,regOpnd,false);
        }
        else {
          pRVar10 = IR::Opnd::AsRegOpnd(pOVar2);
          local_38 = pRVar10->m_reg;
          BVUnitT<unsigned_long>::AssertRange((uint)local_38);
          if (((this->activeRegs).word >> ((ulong)local_38 & 0x3f) & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar9 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x3aa,"(!this->activeRegs.Test(reg))","Shouldn\'t be active");
            if (!bVar7) {
LAB_005873f3:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar9 = 0;
          }
        }
        pLVar11 = this;
        AssignTempReg(this,this_01,local_38);
      }
    }
    if (!bVar5) {
      return;
    }
  }
  else {
    AssignTempReg(this,this_01,local_38);
  }
  if ((*(ushort *)&this_01->field_0x9c & 0x208) == 0) {
    InsertStore(this,instr,regOpnd->m_sym,local_38);
    pLVar11 = this;
  }
LAB_00587361:
  SetReg(pLVar11,regOpnd);
  return;
}

Assistant:

void
LinearScan::SetDstReg(IR::Instr *instr)
{
    //
    // Enregister dst
    //

    IR::Opnd *dst = instr->GetDst();

    if (dst == nullptr)
    {
        return;
    }

    if (!dst->IsRegOpnd())
    {
        // This could be, for instance, a store to a sym with a large offset
        // that was just assigned when we saw the use.
        this->linearScanMD.LegalizeDef(instr);
        return;
    }

    IR::RegOpnd * regOpnd = dst->AsRegOpnd();
    /*
     * If this is a register used to setup a callsite per
     * a calling convention then mark it unavailable to allocate
     * until we see a CALL.
     */
    if (regOpnd->m_isCallArg)
    {
        RegNum callSetupReg = regOpnd->GetReg();
        callSetupRegs.Set(callSetupReg);
    }

    StackSym * stackSym = regOpnd->m_sym;

    // Arg slot sym can be in a RegOpnd for param passed via registers
    // Just use the assigned register
    if (stackSym == nullptr || stackSym->IsArgSlotSym())
    {
        //
        // Already allocated register. just spill the destination
        //
        RegNum reg = regOpnd->GetReg();
        if(LinearScan::IsAllocatable(reg))
        {
            this->SpillReg(reg);
        }
        this->tempRegs.Clear(reg);
    }
    else
    {
        if (regOpnd->GetReg() != RegNOREG)
        {
            this->RecordLoopUse(nullptr, regOpnd->GetReg());
            // Nothing to do
            return;
        }

        Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;
        uint32 useCountCost = LinearScan::GetUseSpillCost(this->loopNest, (this->currentOpHelperBlock != nullptr));
        // Optimistically decrease the useCount.  We'll undo this if we put it on the defList.
        lifetime->SubFromUseCount(useCountCost, this->curLoop);

        if (lifetime->isSpilled)
        {
            if (stackSym->IsConst() && !IsSymNonTempLocalVar(stackSym))
            {
                // We will reload the constant (but in debug mode, we still need to process this if this is a user var).
                return;
            }

            RegNum reg = regOpnd->GetReg();

            if (reg != RegNOREG)
            {
                // It is already assigned, just record it as a temp reg
                this->AssignTempReg(lifetime, reg);
            }
            else
            {
                IR::Opnd *src1 = instr->GetSrc1();
                IR::Opnd *src2 = instr->GetSrc2();

                if ((src1 && src1->IsRegOpnd() && src1->AsRegOpnd()->m_sym == stackSym) ||
                    (src2 && src2->IsRegOpnd() && src2->AsRegOpnd()->m_sym == stackSym))
                {
                    // OpEQ: src1 should have a valid reg (put src2 for other targets)
                    reg = this->GetAssignedTempReg(lifetime, dst->GetType());
                    Assert(reg != RegNOREG);
                    RecordDef(lifetime, instr, 0);
                }
                else
                {
                    // Try second chance
                    reg = this->SecondChanceAllocation(lifetime, false);
                    if (reg != RegNOREG)
                    {

                        Assert(!stackSym->m_isSingleDef);

                        this->SetReg(regOpnd);
                        // Keep track of defs for this lifetime, in case it gets spilled.
                        RecordDef(lifetime, instr, useCountCost);
                        return;
                    }
                    else
                    {
                        reg = this->GetAssignedTempReg(lifetime, dst->GetType());
                        RecordDef(lifetime, instr, 0);
                    }
                }
                if (LowererMD::IsAssign(instr) && instr->GetSrc1()->IsRegOpnd())
                {
                    // Fold the spilled store
                    if (reg != RegNOREG)
                    {
                        // If the value is in a temp reg, it's not valid any more.
                        this->tempRegs.Clear(reg);
                    }

                    IRType srcType = instr->GetSrc1()->GetType();

                    instr->ReplaceDst(IR::SymOpnd::New(stackSym, srcType, this->func));
                    this->linearScanMD.LegalizeDef(instr);
                    return;
                }

                if (reg == RegNOREG)
                {
                    IR::Opnd *src = instr->GetSrc1();
                    if (src && src->IsRegOpnd() && src->AsRegOpnd()->m_sym == stackSym)
                    {
                        // Handle OPEQ's for x86/x64
                        reg = src->AsRegOpnd()->GetReg();
                        AssertMsg(!this->activeRegs.Test(reg), "Shouldn't be active");
                    }
                    else
                    {
                        // The lifetime was spilled, but we still need a reg for this operand.
                        reg = this->FindReg(nullptr, regOpnd);
                    }
                    this->AssignTempReg(lifetime, reg);
                }
            }

            if (!lifetime->isDeadStore && !lifetime->isSecondChanceAllocated)
            {
                // Insert a store since the lifetime is spilled
                this->InsertStore(instr, regOpnd->m_sym, reg);
            }
        }
        else
        {
            if (lifetime->isOpHelperSpilled)
            {
                // We must be in a helper block and the lifetime must
                // start before the helper block
                Assert(this->IsInHelperBlock());
                Assert(lifetime->start < this->HelperBlockStartInstrNumber());

                RegNum reg = lifetime->reg;
                Assert(this->opHelperSpilledRegs.Test(reg));

                if (this->activeRegs.Test(reg))
                {
                    // The reg must have been used locally in the helper block
                    // by some other lifetime. Just spill it

                    this->SpillReg(reg);
                }

                // We can't save/restore this reg across the helper call because the restore would overwrite
                // this def, but the def means we don't need to spill at all.  Mark the lifetime as cantOpHelperSpill
                // however in case another helper call in this block tries to spill it.
                this->SetCantOpHelperSpill(lifetime);

                this->AddToActive(lifetime);

                this->tempRegs.Clear(reg);
                this->activeRegs.Set(reg);
                if (RegTypes[reg] == TyMachReg)
                {
                    this->intRegUsedCount++;
                }
                else
                {
                    Assert(RegTypes[reg] == TyFloat64);
                    this->floatRegUsedCount++;
                }
            }

            // Keep track of defs for this lifetime, in case it gets spilled.
            RecordDef(lifetime, instr, useCountCost);
        }

        this->SetReg(regOpnd);
    }
}